

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void get_tile_buffers(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,
                     TileBufferDec (*tile_buffers) [64],int start_tile,int end_tile)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  aom_internal_error_info *error_info;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  size_t hdr_offset;
  int is_last;
  TileBufferDec *buf;
  int c;
  int r;
  int tc;
  int tile_rows;
  int tile_cols;
  AV1_COMMON *cm;
  TileBufferDec *buf_00;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb8;
  int tile_size_bytes;
  int iVar4;
  int iVar5;
  
  iVar1 = *(int *)(in_RDI + 0x9c00);
  iVar2 = *(int *)(in_RDI + 0x9c04);
  iVar5 = 0;
  for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
    for (tile_size_bytes = 0; tile_size_bytes < iVar1; tile_size_bytes = tile_size_bytes + 1) {
      error_info = (aom_internal_error_info *)
                   (in_RCX + (long)iVar4 * 0x400 + (long)tile_size_bytes * 0x10);
      uVar3 = (uint)(iVar5 == in_R9D);
      buf_00 = (TileBufferDec *)0x0;
      if ((in_R8D <= iVar5) && (iVar5 <= in_R9D)) {
        if (in_RDX <= in_RSI) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                             "Data ended before all tiles were read.");
        }
        get_tile_buffer((uint8_t *)CONCAT44(iVar5,iVar4),tile_size_bytes,in_stack_ffffffffffffffb8,
                        error_info,(uint8_t **)CONCAT44(uVar3,in_stack_ffffffffffffffa8),buf_00);
      }
      iVar5 = iVar5 + 1;
    }
  }
  return;
}

Assistant:

static inline void get_tile_buffers(
    AV1Decoder *pbi, const uint8_t *data, const uint8_t *data_end,
    TileBufferDec (*const tile_buffers)[MAX_TILE_COLS], int start_tile,
    int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tc = 0;

  for (int r = 0; r < tile_rows; ++r) {
    for (int c = 0; c < tile_cols; ++c, ++tc) {
      TileBufferDec *const buf = &tile_buffers[r][c];

      const int is_last = (tc == end_tile);
      const size_t hdr_offset = 0;

      if (tc < start_tile || tc > end_tile) continue;

      if (data + hdr_offset >= data_end)
        aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                           "Data ended before all tiles were read.");
      data += hdr_offset;
      get_tile_buffer(data_end, pbi->tile_size_bytes, is_last, &pbi->error,
                      &data, buf);
    }
  }
}